

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O1

void __thiscall
duckdb::MetaPipeline::GetPipelines
          (MetaPipeline *this,vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *result,
          bool recursive)

{
  pointer psVar1;
  MetaPipeline *this_00;
  undefined7 in_register_00000011;
  shared_ptr<duckdb::MetaPipeline,_true> *child;
  pointer this_01;
  
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
  ::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::shared_ptr<duckdb::Pipeline,true>*,std::vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>>>
            ((vector<duckdb::shared_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::shared_ptr<duckdb::Pipeline,true>>>
              *)result,
             (result->
             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             ).
             super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (this->pipelines).
             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->pipelines).
             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((int)CONCAT71(in_register_00000011,recursive) != 0) {
    psVar1 = (this->children).
             super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
             .
             super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (this->children).
                   super_vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::MetaPipeline,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != psVar1;
        this_01 = this_01 + 1) {
      this_00 = shared_ptr<duckdb::MetaPipeline,_true>::operator->(this_01);
      GetPipelines(this_00,result,true);
    }
  }
  return;
}

Assistant:

void MetaPipeline::GetPipelines(vector<shared_ptr<Pipeline>> &result, bool recursive) {
	result.insert(result.end(), pipelines.begin(), pipelines.end());
	if (recursive) {
		for (auto &child : children) {
			child->GetPipelines(result, true);
		}
	}
}